

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntt.cpp
# Opt level: O1

void ntt(int k,vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *v,bool inv)

{
  iterator __position;
  unsigned_long_long uVar1;
  uint uVar2;
  vector<unsigned_long_long,std::allocator<unsigned_long_long>> *pvVar3;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *pvVar4;
  ulong uVar5;
  pointer puVar6;
  int k_00;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auStack_78 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> even;
  undefined1 auStack_58 [8];
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> odd;
  
  if (k != 0) {
    auStack_78 = (undefined1  [8])0x0;
    even.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    even.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_58 = (undefined1  [8])0x0;
    odd.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    puVar6 = (v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar6) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        pvVar3 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)auStack_58;
        if ((uVar8 & 1) == 0) {
          pvVar3 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)auStack_78;
        }
        __position._M_current = *(unsigned_long_long **)(pvVar3 + 8);
        if (__position._M_current == *(unsigned_long_long **)(pvVar3 + 0x10)) {
          pvVar3 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)auStack_58;
          if ((uVar8 & 1) == 0) {
            pvVar3 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)auStack_78;
          }
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>
                    (pvVar3,__position,(unsigned_long_long *)((long)puVar6 + lVar7));
        }
        else {
          *__position._M_current = *(unsigned_long_long *)((long)puVar6 + lVar7);
          *(unsigned_long_long **)(pvVar3 + 8) = __position._M_current + 1;
        }
        uVar8 = uVar8 + 1;
        puVar6 = (v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 8;
      } while (uVar8 < (ulong)((long)(v->
                                     super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 3
                              ));
    }
    k_00 = k + -1;
    ntt(k_00,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_78,inv);
    ntt(k_00,(vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)auStack_58,inv);
    pvVar4 = &wInv;
    if (!inv) {
      pvVar4 = &w;
    }
    if (k_00 != 0x1f) {
      uVar1 = (pvVar4->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
              _M_impl.super__Vector_impl_data._M_start[k];
      uVar2 = 1 << ((byte)k_00 & 0x1f);
      puVar6 = (v->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = 1;
      if (1 < (int)uVar2) {
        uVar8 = (ulong)uVar2;
      }
      uVar5 = 1;
      uVar9 = 0;
      do {
        puVar6[uVar9] =
             ((*(pointer)((long)auStack_58 + uVar9 * 8) * uVar5) % 0xc0000001 +
             *(pointer)((long)auStack_78 + uVar9 * 8)) % 0xc0000001;
        puVar6[(long)(int)uVar2 + uVar9] =
             ((((*(pointer)((long)auStack_58 + uVar9 * 8) * uVar5) / 0xc0000001) * 0xc0000001 -
              *(pointer)((long)auStack_58 + uVar9 * 8) * uVar5) +
              *(pointer)((long)auStack_78 + uVar9 * 8) + 0xc0000001) % 0xc0000001;
        uVar5 = (uVar5 * uVar1) % 0xc0000001;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58);
    }
    if (auStack_78 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_78);
    }
  }
  return;
}

Assistant:

void ntt(int k, vector<ull>& v, bool inv) { // n = 2^k
    if (!k) return;
    vector<ull> even, odd;
    rep(i, 0, v.size()) ((i % 2) ? odd : even).push_back(v[i]);
    ntt(k - 1, even, inv);
    ntt(k - 1, odd, inv);
    // (2^k)-th root of unity: omega1^(2^k) = 1 (mod P here)
    ull omega1 = w[k];
    if (inv) omega1 = wInv[k];
    ull omega = 1;
    rep(i, 0, (1 << (k - 1))) {
        v[i] = (even[i] + (omega * odd[i]) % P) % P;
        v[i + (1 << (k - 1))] = (P + even[i] - (omega * odd[i]) % P) % P;
        omega = (omega1 * omega) % P;
    }
}